

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertSOSCollection
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ArrayRef<int> *sosno,ArrayRef<double> *ref,bool fAllSOS2)

{
  CStringRef arg0;
  CStringRef msg;
  CStringRef msg_00;
  SOSExtraInfo ei;
  bool bVar1;
  int *piVar2;
  double *pdVar3;
  Error *this_00;
  size_type sVar4;
  pointer ppVar5;
  byte in_CL;
  size_t i_00;
  ArrayRef<double> *in_RDX;
  SOS_1or2_Constraint<2> *in_RSI;
  string *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_int>_>,_bool> pVar6;
  NodeRange NVar7;
  NodeRange NVar8;
  pair<const_double,_int> *wv;
  const_iterator __end4;
  const_iterator __begin4;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *__range4;
  vector<double,_std::allocator<double>_> weights;
  vector<int,_std::allocator<int>_> vars;
  pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *group;
  iterator __end2;
  iterator __begin2;
  map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
  *__range2;
  mapped_type *sos_group;
  size_t i;
  map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
  sos_map;
  NodeIndexRange in_stack_fffffffffffffbb8;
  ValueNode *in_stack_fffffffffffffbc0;
  ValueNode *__rhs;
  NodeIndexRange in_stack_fffffffffffffbc8;
  NodeIndexRange __lhs;
  ValueNode *in_stack_fffffffffffffbd0;
  undefined1 *__n;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  undefined1 uVar9;
  map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
  *in_stack_fffffffffffffc00;
  int iVar10;
  Error *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  byte in_stack_fffffffffffffc17;
  _Rb_tree_iterator<std::pair<const_double,_int>_> in_stack_fffffffffffffc18;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  *in_stack_fffffffffffffc20;
  mapped_type *in_stack_fffffffffffffc28;
  ValueNode *in_stack_fffffffffffffc48;
  NodeIndexRange in_stack_fffffffffffffc50;
  NodeRange NVar11;
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [176];
  NodeRange local_2b8;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  Bounds local_248;
  Bounds local_238;
  SOSExtraInfo local_228 [10];
  reference local_188;
  _Self local_180;
  _Self local_178;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *local_170;
  undefined1 local_150 [31];
  undefined1 local_131;
  BasicCStringRef<char> local_130 [6];
  _Base_ptr local_100;
  reference local_f8;
  _Self local_f0;
  _Self local_e8;
  undefined1 *local_e0;
  undefined1 local_d1;
  BasicCStringRef<char> local_d0 [6];
  _Base_ptr local_a0;
  byte local_98;
  pair<const_double,_int> local_90;
  _Base_ptr local_80;
  byte local_78;
  mapped_type *local_60;
  size_t local_58;
  undefined1 local_50 [55];
  byte local_19;
  
  local_19 = in_CL & 1;
  std::
  map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
  ::map((map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
         *)0x6152d4);
  local_58 = ArrayRef<double>::size(in_RDX);
  while( true ) {
    do {
      do {
        i_00 = local_58 - 1;
        if (local_58 == 0) {
          local_e0 = local_50;
          local_58 = i_00;
          local_e8._M_node =
               (_Base_ptr)
               std::
               map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
               ::begin((map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffbb8);
          local_f0._M_node =
               (_Base_ptr)
               std::
               map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
               ::end((map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffbb8);
          NVar11.ir_ = in_stack_fffffffffffffc50;
          NVar11.pvn_ = in_stack_fffffffffffffc48;
          NVar7.ir_ = in_stack_fffffffffffffbc8;
          NVar7.pvn_ = in_stack_fffffffffffffbd0;
          NVar8.ir_ = in_stack_fffffffffffffbb8;
          NVar8.pvn_ = in_stack_fffffffffffffbc0;
          while( true ) {
            bVar1 = std::operator!=(&local_e8,&local_f0);
            if (!bVar1) {
              std::
              map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
              ::~map((map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
                      *)0x615e21);
              return;
            }
            local_f8 = std::
                       _Rb_tree_iterator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>
                       ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>
                                    *)0x6155e8);
            sVar4 = std::
                    map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    ::size((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                            *)0x615605);
            uVar9 = false;
            if ((sVar4 != 0) && (uVar9 = false, (local_f8->second).first != 0)) {
              local_100 = (_Base_ptr)
                          std::
                          map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                          ::begin((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                                   *)NVar8.ir_);
              ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator->
                                 ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)0x615652
                                 );
              uVar9 = ppVar5->first != 0.0;
            }
            iVar10 = (int)((ulong)in_stack_fffffffffffffc00 >> 0x20);
            if ((bool)uVar9 != false) break;
            sVar4 = std::
                    map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    ::size((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                            *)0x61577e);
            if (1 < sVar4) {
              __n = local_150;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)0x61579a);
              std::
              map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
              size((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    *)0x6157ab);
              std::vector<int,_std::allocator<int>_>::reserve
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                         (size_type)__n);
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)0x6157cc);
              std::
              map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
              size((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    *)0x6157dd);
              std::vector<double,_std::allocator<double>_>::reserve
                        (in_stack_fffffffffffffbf0,(size_type)__n);
              local_170 = &(local_f8->second).second;
              local_178._M_node =
                   (_Base_ptr)
                   std::
                   map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   ::begin((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                            *)NVar8.ir_);
              local_180._M_node =
                   (_Base_ptr)
                   std::
                   map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   ::end((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                          *)NVar8.ir_);
              while( true ) {
                bVar1 = std::operator!=(&local_178,&local_180);
                if (!bVar1) break;
                local_188 = std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator*
                                      ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)
                                       0x615859);
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)NVar7.pvn_,
                           (value_type_conflict3 *)NVar7.ir_);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)NVar7.pvn_,(value_type *)NVar7.ir_);
                std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator++
                          ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)NVar8.pvn_);
              }
              if ((local_f8->first < 0) || ((local_19 & 1) != 0)) {
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                           (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc08);
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                           (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc08);
                if ((local_19 & 1) == 0) {
                  SOSExtraInfo::Bounds::Bounds(&local_248,-1e+100,1e+100);
                  SOSExtraInfo::SOSExtraInfo(local_228,local_248);
                }
                else {
                  SOSExtraInfo::Bounds::Bounds(&local_238,1.0,1.0);
                  SOSExtraInfo::SOSExtraInfo(local_228,local_238);
                }
                __lhs = NVar7.ir_;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
                std::operator+((char *)__lhs,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               NVar8.pvn_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __lhs,NVar8.pvn_._7_1_);
                ei.bounds_.ub_ = (double)in_RDX;
                ei.bounds_.lb_ = (double)in_RDI;
                SOS_1or2_Constraint<2>::
                SOS_1or2_Constraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>
                          (in_RSI,(vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc28,
                           (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc20,ei,
                           (string *)in_stack_fffffffffffffc18._M_node);
                NVar7 = ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                        ::AddConstraint<mp::SOS_1or2_Constraint<2>>
                                  ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                                    *)NVar11.ir_,(SOS_1or2_Constraint<2> *)NVar11.pvn_);
                local_2b8 = NVar7;
                SOS_1or2_Constraint<2>::~SOS_1or2_Constraint((SOS_1or2_Constraint<2> *)NVar8.pvn_);
                std::__cxx11::string::~string(local_268);
                std::__cxx11::string::~string(local_288);
                std::__cxx11::string::~string(local_2a8);
                std::vector<double,_std::allocator<double>_>::~vector
                          ((vector<double,_std::allocator<double>_> *)NVar7.pvn_);
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)NVar7.pvn_);
              }
              else {
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                           (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc08);
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                           (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc08);
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
                __rhs = NVar8.pvn_;
                std::operator+((char *)NVar7.ir_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               NVar7.ir_,(char)((ulong)__rhs >> 0x38));
                SOS_1or2_Constraint<1>::
                SOS_1or2_Constraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>
                          ((SOS_1or2_Constraint<1> *)NVar11.ir_,
                           (vector<int,_std::allocator<int>_> *)NVar11.pvn_,&in_RDX->save_,in_RDI);
                NVar8 = ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                        ::AddConstraint<mp::SOS_1or2_Constraint<1>>
                                  ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                                    *)NVar11.ir_,(SOS_1or2_Constraint<1> *)NVar11.pvn_);
                NVar11 = NVar8;
                SOS_1or2_Constraint<1>::~SOS_1or2_Constraint((SOS_1or2_Constraint<1> *)NVar8.pvn_);
                std::__cxx11::string::~string(local_368);
                std::__cxx11::string::~string(local_388);
                std::__cxx11::string::~string(local_3a8);
                std::vector<double,_std::allocator<double>_>::~vector
                          ((vector<double,_std::allocator<double>_> *)NVar7.pvn_);
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)NVar7.pvn_);
              }
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)NVar7.pvn_);
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)NVar7.pvn_);
            }
            std::
            _Rb_tree_iterator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>
            ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>
                          *)NVar8.pvn_);
          }
          local_131 = 1;
          piVar2 = (int *)__cxa_allocate_exception(0x18);
          fmt::BasicCStringRef<char>::BasicCStringRef
                    (local_130,"SOS/SOS2 constraint {} has repeated 0 weights");
          arg0.data_._7_1_ = uVar9;
          arg0.data_._0_7_ = in_stack_fffffffffffffbf8;
          fmt::format<int>(arg0,piVar2);
          fmt::BasicCStringRef<char>::BasicCStringRef
                    ((BasicCStringRef<char> *)NVar8.pvn_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)NVar8.ir_)
          ;
          msg_00.data_._7_1_ = in_stack_fffffffffffffc17;
          msg_00.data_._0_7_ = in_stack_fffffffffffffc10;
          Error::Error(in_stack_fffffffffffffc08,msg_00,iVar10);
          local_131 = 0;
          __cxa_throw(piVar2,&Error::typeinfo,Error::~Error);
        }
        local_58 = i_00;
        piVar2 = ArrayRef<int>::operator[]((ArrayRef<int> *)in_RSI,i_00);
      } while (*piVar2 == 0);
      ArrayRef<int>::operator[]((ArrayRef<int> *)in_RSI,local_58);
      in_stack_fffffffffffffc28 =
           std::
           map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
           ::operator[](in_stack_fffffffffffffc00,
                        (key_type_conflict *)
                        CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      in_stack_fffffffffffffc20 = &in_stack_fffffffffffffc28->second;
      local_60 = in_stack_fffffffffffffc28;
      pdVar3 = ArrayRef<double>::operator[](in_RDX,local_58);
      std::pair<const_double,_int>::pair<unsigned_long_&,_true>(&local_90,pdVar3,&local_58);
      pVar6 = std::
              map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
              insert((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                      *)in_stack_fffffffffffffbd0,(value_type *)in_stack_fffffffffffffbc8);
      in_stack_fffffffffffffc18 = pVar6.first._M_node;
      in_stack_fffffffffffffc17 = pVar6.second;
      local_a0 = in_stack_fffffffffffffc18._M_node;
      local_98 = in_stack_fffffffffffffc17;
      local_80 = in_stack_fffffffffffffc18._M_node;
      local_78 = in_stack_fffffffffffffc17;
    } while (((in_stack_fffffffffffffc17 ^ 0xff) & 1) == 0);
    if ((local_19 & 1) == 0) break;
    pdVar3 = ArrayRef<double>::operator[](in_RDX,local_58);
    if ((*pdVar3 != 0.0) || (NAN(*pdVar3))) break;
    local_60->first = local_60->first + 1;
  }
  local_d1 = 1;
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef
            (local_d0,"SOS/SOS2 constraint {} has repeated weight {}");
  piVar2 = ArrayRef<int>::operator[]((ArrayRef<int> *)in_RSI,local_58);
  iVar10 = (int)((ulong)piVar2 >> 0x20);
  ArrayRef<double>::operator[](in_RDX,local_58);
  fmt::format<int,double>
            ((CStringRef)in_stack_fffffffffffffc18._M_node,
             (int *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),(double *)this_00)
  ;
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)in_stack_fffffffffffffbc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb8);
  msg.data_._7_1_ = in_stack_fffffffffffffc17;
  msg.data_._0_7_ = in_stack_fffffffffffffc10;
  Error::Error(this_00,msg,iVar10);
  local_d1 = 0;
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void ConvertSOSCollection(ArrayRef<int> sosno, ArrayRef<double> ref,
                            bool fAllSOS2) {
    assert(sosno.size() == ref.size());
    std::map< int,       // pair.first: N repeated zeros
        std::pair< int, std::map< double, int > > > sos_map;
    for (auto i=ref.size(); i--; )
      if (sosno[i]) {
        auto& sos_group = sos_map[sosno[i]];
        if (!sos_group.second.insert( {ref[i], i} ).second) {
          if (!fAllSOS2 || ref[i]) // weights 0 for all: redundant PL linearization
            MP_RAISE(
                  fmt::format(
                    "SOS/SOS2 constraint {} has repeated weight {}",
                    sosno[i], ref[i]));
          else
            ++sos_group.first;
        }
      }
    for (const auto& group: sos_map) {
      if (group.second.second.size()
          && group.second.first
          && group.second.second.begin()->first)  // key non-0
        MP_RAISE(
              fmt::format(
                "SOS/SOS2 constraint {} has repeated 0 weights", group.first));
      if (group.second.second.size()>1) {
        std::vector<int> vars;
        vars.reserve(group.second.second.size());
        std::vector<double> weights;
        weights.reserve(group.second.second.size());
        for (const auto& wv: group.second.second) {
          weights.push_back(wv.first);
          vars.push_back(wv.second);
        }
        if (group.first<0 || fAllSOS2)
          AddConstraint(
                SOS2Constraint(vars, weights,
                               fAllSOS2 ?    // for linearized PL
                                             SOSExtraInfo{{1.0, 1.0}} :
                                             SOSExtraInfo{},
                               (fAllSOS2 ? "SOS2_PL_" : "SOS2_")
                               + std::to_string(group.first)
                               + '_'));
        else
          AddConstraint(
                SOS1Constraint(vars, weights,
                               "SOS1_"
                               + std::to_string(group.first)
                               + '_'));
      }
    }
  }